

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

uint PacketProcessor::Number(uchar b1,uchar b2,uchar b3,uchar b4)

{
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  uchar b4_local;
  uchar b3_local;
  uchar b2_local;
  uchar b1_local;
  
  local_9 = b1;
  if (b1 == 0xfe) {
    local_9 = '\x01';
  }
  local_a = b2;
  if (b2 == 0xfe) {
    local_a = '\x01';
  }
  local_b = b3;
  if (b3 == 0xfe) {
    local_b = '\x01';
  }
  local_c = b4;
  if (b4 == 0xfe) {
    local_c = '\x01';
  }
  if (local_9 == '\0') {
    local_9 = 0x80;
  }
  if (local_a == '\0') {
    local_a = 0x80;
  }
  if (local_b == '\0') {
    local_b = 0x80;
  }
  if (local_c == '\0') {
    local_c = 0x80;
  }
  return (uint)(byte)(local_c - 1) * 0xf71ae5 + (uint)(byte)(local_b - 1) * 0xfa09 +
         (uint)(byte)(local_a - 1) * 0xfd + (uint)(byte)(local_9 - 1);
}

Assistant:

unsigned int PacketProcessor::Number(unsigned char b1, unsigned char b2, unsigned char b3, unsigned char b4)
{
	if (b1 == 254) b1 = 1;
	if (b2 == 254) b2 = 1;
	if (b3 == 254) b3 = 1;
	if (b4 == 254) b4 = 1;

	if (b1 == 0) b1 = 128;
	if (b2 == 0) b2 = 128;
	if (b3 == 0) b3 = 128;
	if (b4 == 0) b4 = 128;

	--b1;
	--b2;
	--b3;
	--b4;

	return (b4*PacketProcessor::MAX3 + b3*PacketProcessor::MAX2 + b2*PacketProcessor::MAX1 + b1);
}